

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O0

void __thiscall PathTracerThread::StopAndJoin(PathTracerThread *this)

{
  bool bVar1;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int __sig;
  PathTracerThread *in_RDI;
  memory_order unaff_retaddr;
  undefined1 unaff_retaddr_00;
  atomic<bool> *in_stack_00000008;
  
  bVar1 = IsRunning(in_RDI);
  if (bVar1) {
    std::atomic<bool>::store(in_stack_00000008,(bool)unaff_retaddr_00,unaff_retaddr);
    __sig = 0;
    std::atomic<bool>::store(in_stack_00000008,(bool)unaff_retaddr_00,unaff_retaddr);
    spdlog::debug<char[26]>((char (*) [26])0x1800cd);
    binary_semaphore::signal(&in_RDI->m_viewer_semaphore,__sig,__handler);
    spdlog::debug<char[25]>((char (*) [25])0x1800ea);
    binary_semaphore::signal(&in_RDI->m_pause_semaphore,__sig,__handler_00);
    std::thread::join();
    std::thread::join();
  }
  return;
}

Assistant:

void PathTracerThread::StopAndJoin() {
	if (!IsRunning())
		return;

	m_pause.store(false, std::memory_order_release);
	m_run.store(false, std::memory_order_release);

	spdlog::debug("m_viewer_semaphore signal");
	m_viewer_semaphore.signal();
	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();

	m_path_tracer_thread.join();
	m_viewer_thread.join();
}